

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O3

void __thiscall
cppcms::url_dispatcher::assign<unit_test>
          (url_dispatcher *this,string *regex,member_type member,unit_test *object)

{
  member_type in_R8;
  member_type *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  local_48 = 0;
  local_50 = (member_type *)operator_new(0x18);
  *local_50 = member;
  local_50[1] = (member_type)object;
  local_50[2] = in_R8;
  local_38 = std::_Function_handler<void_(),_cppcms::url_dispatcher::binder0<unit_test>_>::_M_invoke
  ;
  local_40 = std::_Function_handler<void_(),_cppcms::url_dispatcher::binder0<unit_test>_>::
             _M_manager;
  cppcms::url_dispatcher::assign(this,regex,&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(),C *object)
		{
			assign(regex,binder0<C>(member,object));
		}